

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O1

string * __thiscall
jsonrpccxx::type_name_abi_cxx11_(string *__return_storage_ptr__,jsonrpccxx *this,value_t t)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((int)this) {
  case 1:
    pcVar2 = "object";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "array";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "string";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "boolean";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "integer";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "unsigned integer";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "float";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "null";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string type_name(json::value_t t) {
    switch (t) {
    case json::value_t::number_integer:
      return "integer";
    case json::value_t::boolean:
      return "boolean";
    case json::value_t::number_float:
      return "float";
    case json::value_t::number_unsigned:
      return "unsigned integer";
    case json::value_t::object:
      return "object";
    case json::value_t::array:
      return "array";
    case json::value_t::string:
      return "string";
    default:
      return "null";
    }
  }